

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O3

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,string *child_path,ByteData *finterprint)

{
  Privkey *this_00;
  pointer puVar1;
  pointer puVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  undefined1 local_d0 [40];
  ByteData256 local_a8;
  ByteData local_90;
  bool local_78;
  undefined3 uStack_77;
  NetType NStack_74;
  ByteData local_70;
  ByteData256 local_58;
  ExtPubkey *local_40;
  ExtPrivkey *local_38;
  
  Pubkey::Pubkey(&this->pubkey_);
  this_00 = &this->privkey_;
  Privkey::Privkey(this_00);
  Extkey::Extkey(&(this->extprivkey_).super_Extkey,&ext_privkey->super_Extkey);
  local_40 = &this->extpubkey_;
  local_38 = &this->extprivkey_;
  Extkey::Extkey(&local_40->super_Extkey);
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->fingerprint_,
             &finterprint->data_);
  if (child_path->_M_string_length != 0) {
    local_d0._0_8_ = local_d0 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"KeyData","");
    ToArrayFromString(&local_e8,child_path,(string *)local_d0,'\0');
    puVar1 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (this->path_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (puVar1 != (pointer)0x0) {
      operator_delete(puVar1,(long)puVar2 - (long)puVar1);
      if (local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_e8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_e8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
  }
  ExtPrivkey::GetExtPubkey((ExtPubkey *)local_d0,ext_privkey);
  (this->extpubkey_).super_Extkey.version_ = local_d0._0_4_;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.fingerprint_,(ByteData *)(local_d0 + 8));
  (this->extpubkey_).super_Extkey.depth_ = local_d0[0x20];
  *(undefined3 *)&(this->extpubkey_).super_Extkey.field_0x21 = local_d0._33_3_;
  (this->extpubkey_).super_Extkey.child_num_ = local_d0._36_4_;
  ByteData256::operator=(&(this->extpubkey_).super_Extkey.chaincode_,&local_a8);
  ByteData::operator=(&(this->extpubkey_).super_Extkey.privkey_.data_,&local_90);
  (this->extpubkey_).super_Extkey.privkey_.is_compressed_ = local_78;
  *(undefined3 *)&(this->extpubkey_).super_Extkey.privkey_.field_0x19 = uStack_77;
  (this->extpubkey_).super_Extkey.privkey_.net_type_ = NStack_74;
  ByteData::operator=(&(this->extpubkey_).super_Extkey.pubkey_.data_,&local_70);
  ByteData256::operator=(&(this->extpubkey_).super_Extkey.tweak_sum_,&local_58);
  if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_d0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._8_8_,local_d0._24_8_ - local_d0._8_8_);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(ext_privkey->super_Extkey).privkey_);
  local_d0[0x18] = (ext_privkey->super_Extkey).privkey_.is_compressed_;
  local_d0._25_3_ = *(undefined3 *)&(ext_privkey->super_Extkey).privkey_.field_0x19;
  local_d0._28_4_ = (ext_privkey->super_Extkey).privkey_.net_type_;
  ByteData::operator=(&this_00->data_,(ByteData *)local_d0);
  (this->privkey_).is_compressed_ = (bool)local_d0[0x18];
  *(undefined3 *)&(this->privkey_).field_0x19 = local_d0._25_3_;
  (this->privkey_).net_type_ = local_d0._28_4_;
  if ((pointer)local_d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ - local_d0._0_8_);
  }
  Privkey::GetPubkey((Pubkey *)local_d0,this_00);
  ByteData::operator=((ByteData *)this,(ByteData *)local_d0);
  if ((pointer)local_d0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ - local_d0._0_8_);
  }
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::string& child_path,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}